

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O3

base_learner * ftrl_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  vw *pvVar2;
  size_t *psVar3;
  undefined8 uVar4;
  float *pfVar5;
  options_i *this;
  int iVar6;
  ftrl *pfVar7;
  option_group_definition *poVar8;
  ostream *poVar9;
  typed_option<unsigned_long> *ptVar10;
  size_t sVar11;
  learner<ftrl,_example> *plVar12;
  uint32_t *puVar13;
  code *predict;
  code *pcVar14;
  float *location;
  float fVar15;
  bool pistol;
  bool ftrl_option;
  string algorithm_name;
  option_group_definition new_options;
  bool local_6b2;
  bool local_6b1;
  ftrl *local_6b0;
  free_ptr<ftrl> local_6a8;
  float *local_698;
  options_i *local_690;
  undefined1 local_688 [112];
  bool local_618;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_600;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5f0;
  string local_5e8;
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  string local_5a8;
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  string local_568;
  undefined1 *local_548;
  long local_540;
  undefined1 local_538 [16];
  option_group_definition local_528;
  undefined1 *local_4f0 [2];
  undefined1 local_4e0 [16];
  undefined1 *local_4d0 [2];
  undefined1 local_4c0 [16];
  string local_4b0;
  undefined1 local_490 [112];
  bool local_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<float> local_2b0;
  typed_option<float> local_210;
  typed_option<bool> local_170;
  typed_option<bool> local_d0;
  
  pfVar7 = calloc_or_throw<ftrl>(1);
  pfVar7->all = (vw *)0x0;
  pfVar7->ftrl_alpha = 0.0;
  pfVar7->ftrl_beta = 0.0;
  (pfVar7->data).update = 0.0;
  (pfVar7->data).ftrl_alpha = 0.0;
  (pfVar7->data).ftrl_beta = 0.0;
  (pfVar7->data).l1_lambda = 0.0;
  (pfVar7->data).l2_lambda = 0.0;
  (pfVar7->data).predict = 0.0;
  pfVar7->no_win_counter = 0;
  pfVar7->early_stop_thres = 0;
  local_6a8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<ftrl>;
  local_6b1 = false;
  local_6b2 = false;
  local_6b0 = pfVar7;
  local_6a8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>._M_head_impl
       = pfVar7;
  local_548 = local_538;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_548,"Follow the Regularized Leader","");
  local_528.m_name._M_dataplus._M_p = (pointer)&local_528.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_528,local_548,local_548 + local_540);
  local_528.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_528.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_528.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_548 != local_538) {
    operator_delete(local_548);
  }
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"ftrl","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_688,&local_568,&local_6b1);
  local_618 = true;
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_588,"FTRL: Follow the Proximal Regularized Leader","");
  std::__cxx11::string::_M_assign((string *)(local_688 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_688);
  poVar8 = VW::config::option_group_definition::add<bool>(&local_528,&local_d0);
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"pistol","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_5a8,&local_6b2);
  local_420 = true;
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"FTRL beta parameter","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_490);
  local_690 = options;
  poVar8 = VW::config::option_group_definition::add<bool>(poVar8,&local_170);
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"ftrl_alpha","");
  local_698 = &pfVar7->ftrl_alpha;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_350,&local_4b0,local_698);
  local_4d0[0] = local_4c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d0,"Learning rate for FTRL optimization","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_210,(typed_option<float> *)local_350);
  poVar8 = VW::config::option_group_definition::add<float>(poVar8,&local_210);
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"ftrl_beta","");
  location = &pfVar7->ftrl_beta;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_3f0,&local_5e8,location);
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4f0,"Learning rate for FTRL optimization","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_2b0,(typed_option<float> *)local_3f0);
  VW::config::option_group_definition::add<float>(poVar8,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0]);
  }
  pfVar7 = local_6b0;
  local_3f0._0_8_ = &PTR__typed_option_002d1760;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1760;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_4d0[0] != local_4c0) {
    operator_delete(local_4d0[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002d1760;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  pfVar5 = local_698;
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  this = local_690;
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1618;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_5c8[0] != local_5b8) {
    operator_delete(local_5c8[0]);
  }
  local_490._0_8_ = &PTR__typed_option_002d1618;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d1618;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_588[0] != local_578) {
    operator_delete(local_588[0]);
  }
  local_688._0_8_ = &PTR__typed_option_002d1618;
  if (local_5f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5f0._M_pi);
  }
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_688);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p);
  }
  (**this->_vptr_options_i)(this,&local_528);
  if (local_6b1 == false) {
    if (local_6b2 == false) {
      plVar12 = (learner<ftrl,_example> *)0x0;
      goto LAB_001e9e53;
    }
    pp_Var1 = (_func_int **)(local_688 + 0x10);
    local_688._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"ftrl_alpha","");
    iVar6 = (*this->_vptr_options_i[1])(this,local_688);
    if ((char)iVar6 == '\0') {
      fVar15 = 1.0;
    }
    else {
      fVar15 = *pfVar5;
    }
    *pfVar5 = fVar15;
    if ((_func_int **)local_688._0_8_ != pp_Var1) {
      operator_delete((void *)local_688._0_8_);
    }
    local_688._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"ftrl_beta","");
    iVar6 = (*this->_vptr_options_i[1])(this);
    if ((char)iVar6 != '\0') goto LAB_001e9a9e;
    fVar15 = 0.5;
  }
  else {
    pp_Var1 = (_func_int **)(local_688 + 0x10);
    local_688._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"ftrl_alpha","");
    iVar6 = (*this->_vptr_options_i[1])(this,local_688);
    if ((char)iVar6 == '\0') {
      fVar15 = 0.005;
    }
    else {
      fVar15 = *pfVar5;
    }
    *pfVar5 = fVar15;
    if ((_func_int **)local_688._0_8_ != pp_Var1) {
      operator_delete((void *)local_688._0_8_);
    }
    local_688._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"ftrl_beta","");
    iVar6 = (*this->_vptr_options_i[1])(this);
    if ((char)iVar6 == '\0') {
      fVar15 = 0.1;
    }
    else {
LAB_001e9a9e:
      fVar15 = *location;
    }
  }
  *location = fVar15;
  if ((undefined1 *)local_688._0_8_ != local_688 + 0x10) {
    operator_delete((void *)local_688._0_8_);
  }
  pfVar7->all = all;
  pfVar7->no_win_counter = 0;
  local_688._0_8_ = local_688 + 0x10;
  local_688._8_8_ = (pointer)0x0;
  local_688[0x10] = 0;
  if (local_6b1 == true) {
    std::__cxx11::string::_M_replace((ulong)local_688,0,(char *)0x0,0x27ea68);
    pcVar14 = learn_proximal<false>;
    if (all->audit != false) {
      pcVar14 = learn_proximal<true>;
    }
  }
  else if (local_6b2 == true) {
    std::__cxx11::string::_M_replace((ulong)local_688,0,(char *)0x0,0x27ea76);
    pcVar14 = learn_pistol;
  }
  else {
    pcVar14 = (_func_void_ftrl_ptr_learner<char,_example>_ptr_example_ptr *)0x0;
  }
  fVar15 = pfVar7->ftrl_beta;
  (pfVar7->data).ftrl_alpha = pfVar7->ftrl_alpha;
  (pfVar7->data).ftrl_beta = fVar15;
  pvVar2 = pfVar7->all;
  (pfVar7->data).l1_lambda = pvVar2->l1_lambda;
  (pfVar7->data).l2_lambda = pvVar2->l2_lambda;
  if ((all->weights).sparse == true) {
    sparse_parameters::stride_shift(&(all->weights).sparse_weights,2);
  }
  else {
    (all->weights).dense_weights._stride_shift = 2;
  }
  if (all->quiet == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Enabling FTRL based optimization",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Algorithm used: ",0x10);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_688._0_8_,local_688._8_8_);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ftrl_alpha = ",0xd);
    poVar9 = std::ostream::_M_insert<double>((double)*local_698);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ftrl_beta = ",0xc);
    poVar9 = std::ostream::_M_insert<double>((double)*location);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    local_490._0_8_ = local_490 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"early_terminate","");
    ptVar10 = VW::config::options_i::get_typed_option<unsigned_long>(this,(string *)local_490);
    psVar3 = (ptVar10->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (psVar3 == (size_t *)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = *psVar3;
    }
    local_6b0->early_stop_thres = sVar11;
    if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
      operator_delete((void *)local_490._0_8_);
    }
  }
  predict = predict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    predict = predict<true>;
  }
  puVar13 = &(all->weights).dense_weights._stride_shift;
  if (((all->weights).sparse & 1U) != 0) {
    puVar13 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar12 = LEARNER::init_learner<ftrl,example,LEARNER::learner<char,example>>
                      (&local_6a8,pcVar14,predict,1L << ((byte)*puVar13 & 0x3f));
  uVar4 = *(undefined8 *)(plVar12 + 0x18);
  *(undefined8 *)(plVar12 + 0x48) = uVar4;
  *(code **)(plVar12 + 0x50) = sensitivity;
  pcVar14 = multipredict<false>;
  if (((all->hash_inv | all->audit) & 1U) != 0) {
    pcVar14 = multipredict<true>;
  }
  *(code **)(plVar12 + 0x40) = pcVar14;
  *(code **)(plVar12 + 0x80) = save_load;
  *(undefined8 *)(plVar12 + 0x70) = uVar4;
  *(undefined8 *)(plVar12 + 0x78) = *(undefined8 *)(plVar12 + 0x20);
  *(undefined8 *)(plVar12 + 0x88) = uVar4;
  *(undefined8 *)(plVar12 + 0x90) = *(undefined8 *)(plVar12 + 0x20);
  *(code **)(plVar12 + 0x98) = end_pass;
  if ((undefined1 *)local_688._0_8_ != local_688 + 0x10) {
    operator_delete((void *)local_688._0_8_);
  }
LAB_001e9e53:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_528.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.m_name._M_dataplus._M_p != &local_528.m_name.field_2) {
    operator_delete(local_528.m_name._M_dataplus._M_p);
  }
  if (local_6a8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>.
      _M_head_impl != (ftrl *)0x0) {
    (*(code *)local_6a8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_6a8._M_t.super___uniq_ptr_impl<ftrl,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ftrl_*,_void_(*)(void_*)>.super__Head_base<0UL,_ftrl_*,_false>
               ._M_head_impl);
  }
  return (base_learner *)plVar12;
}

Assistant:

base_learner* ftrl_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<ftrl>();
  bool ftrl_option = false;
  bool pistol = false;

  option_group_definition new_options("Follow the Regularized Leader");
  new_options.add(make_option("ftrl", ftrl_option).keep().help("FTRL: Follow the Proximal Regularized Leader"))
      .add(make_option("pistol", pistol).keep().help("FTRL beta parameter"))
      .add(make_option("ftrl_alpha", b->ftrl_alpha).help("Learning rate for FTRL optimization"))
      .add(make_option("ftrl_beta", b->ftrl_beta).help("Learning rate for FTRL optimization"));
  options.add_and_parse(new_options);

  if (!ftrl_option && !pistol)
  {
    return nullptr;
  }

  // Defaults that are specific to the mode that was chosen.
  if (ftrl_option)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 0.005f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.1f;
  }
  else if (pistol)
  {
    b->ftrl_alpha = options.was_supplied("ftrl_alpha") ? b->ftrl_alpha : 1.0f;
    b->ftrl_beta = options.was_supplied("ftrl_beta") ? b->ftrl_beta : 0.5f;
  }

  b->all = &all;
  b->no_win_counter = 0;

  void (*learn_ptr)(ftrl&, single_learner&, example&) = nullptr;

  string algorithm_name;
  if (ftrl_option)
  {
    algorithm_name = "Proximal-FTRL";
    if (all.audit)
      learn_ptr = learn_proximal<true>;
    else
      learn_ptr = learn_proximal<false>;
  }
  else if (pistol)
  {
    algorithm_name = "PiSTOL";
    learn_ptr = learn_pistol;
  }
  b->data.ftrl_alpha = b->ftrl_alpha;
  b->data.ftrl_beta = b->ftrl_beta;
  b->data.l1_lambda = b->all->l1_lambda;
  b->data.l2_lambda = b->all->l2_lambda;

  all.weights.stride_shift(2);  // NOTE: for more parameter storage

  if (!all.quiet)
  {
    cerr << "Enabling FTRL based optimization" << endl;
    cerr << "Algorithm used: " << algorithm_name << endl;
    cerr << "ftrl_alpha = " << b->ftrl_alpha << endl;
    cerr << "ftrl_beta = " << b->ftrl_beta << endl;
  }

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  learner<ftrl, example>* l;
  if (all.audit || all.hash_inv)
    l = &init_learner(b, learn_ptr, predict<true>, UINT64_ONE << all.weights.stride_shift());
  else
    l = &init_learner(b, learn_ptr, predict<false>, UINT64_ONE << all.weights.stride_shift());
  l->set_sensitivity(sensitivity);
  if (all.audit || all.hash_inv)
    l->set_multipredict(multipredict<true>);
  else
    l->set_multipredict(multipredict<false>);
  l->set_save_load(save_load);
  l->set_end_pass(end_pass);
  return make_base(*l);
}